

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_command_runner.cc
# Opt level: O2

void __thiscall
PosixCommandRunner::RunCommand
          (PosixCommandRunner *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command)

{
  pointer pbVar1;
  int iVar2;
  string *arg;
  pointer pbVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  char *local_58;
  pid_t *local_50;
  vector<char_*,_std::allocator<char_*>_> args;
  
  if (this->current_process_ == -1) {
    local_50 = &this->current_process_;
    args.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    args.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    args.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    pbVar1 = (command->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar3 = (command->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1)
    {
      local_58 = (pbVar3->_M_dataplus)._M_p;
      std::vector<char*,std::allocator<char*>>::emplace_back<char*>
                ((vector<char*,std::allocator<char*>> *)&args,&local_58);
    }
    local_58 = (char *)0x0;
    std::vector<char*,std::allocator<char*>>::emplace_back<char*>
              ((vector<char*,std::allocator<char*>> *)&args,&local_58);
    iVar2 = posix_spawnp(local_50,(((command->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                         (posix_spawn_file_actions_t *)0x0,(posix_spawnattr_t *)0x0,
                         args.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                         super__Vector_impl_data._M_start,_environ);
    if (iVar2 != 0) {
      this->current_process_ = -1;
      this->previous_command_failed_ = true;
    }
    this->previous_command_failed_ = false;
    std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
              (&args.super__Vector_base<char_*,_std::allocator<char_*>_>);
    return;
  }
  __assert_fail("current_process_ == -1 && \"Previous command is still running\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/posix_command_runner.cc"
                ,0x2f,
                "virtual void PosixCommandRunner::RunCommand(const std::vector<std::string> &)");
}

Assistant:

void PosixCommandRunner::RunCommand(const std::vector<std::string>& command) {
  assert(current_process_ == -1 && "Previous command is still running");

  // Convert argument strings to char *, as expected by posix_spawnp().
  std::vector<char*> args;
  for (const std::string& arg : command)
    args.push_back(const_cast<char*>(arg.c_str()));
  args.push_back(nullptr);

  // Spawn subprocess.
  if (posix_spawnp(&current_process_, command[0].c_str(), nullptr, nullptr,
                   args.data(), environ) != 0) {
    current_process_ = -1;
    previous_command_failed_ = true;
  }
  previous_command_failed_ = false;
}